

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalGet::Deserialize(LogicalGet *this,Deserializer *deserializer)

{
  string *psVar1;
  table_function_get_virtual_columns_t p_Var2;
  element_type *peVar3;
  table_function_bind_t p_Var4;
  pointer pCVar5;
  _Hash_node_base *params;
  __node_base_ptr p_Var6;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var7;
  pointer pcVar8;
  unsigned_long *__args;
  _Head_base<0UL,_duckdb::LogicalGet_*,_false> _Var9;
  optional_ptr<duckdb::FunctionData,_true> oVar10;
  undefined8 uVar11;
  bool bVar12;
  int iVar13;
  LogicalGet *this_00;
  pointer pLVar14;
  undefined4 extraout_var;
  ClientContext *pCVar15;
  pointer pLVar16;
  pointer pLVar17;
  pointer pLVar18;
  pointer pLVar19;
  reference pvVar20;
  reference pvVar21;
  reference this_01;
  __node_base_ptr p_Var22;
  SerializationException *pSVar23;
  InternalException *this_02;
  CatalogType catalog_type;
  _Rb_tree_header *ret;
  unsigned_long *col_id;
  _Hash_node_base *p_Var24;
  pointer *__ptr;
  __node_base_ptr p_Var25;
  __hash_code __code;
  pointer __old_p;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var26;
  pointer pCVar27;
  unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> result;
  vector<unsigned_long,_true> legacy_column_ids;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  bind_names;
  TableFunctionRef empty_ref;
  virtual_column_map_t virtual_columns;
  TableFunctionBindInput input;
  pair<duckdb::TableFunction,_bool> entry;
  _Head_base<0UL,_duckdb::LogicalGet_*,_false> local_498;
  optional_ptr<duckdb::FunctionData,_true> local_490;
  FunctionData *local_488;
  pointer local_480;
  undefined1 local_478 [64];
  undefined1 local_438 [32];
  undefined1 local_418 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  __node_base local_3e8;
  TableFunctionRef local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [32];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_328;
  vector<duckdb::LogicalType,_true> local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_2d8;
  element_type *local_2d0;
  __node_base local_2c8;
  TableFunction *local_2c0;
  TableFunctionRef *local_2b8;
  LogicalType local_2b0;
  LogicalType local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  LogicalType local_260;
  LogicalType local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  pair<duckdb::TableFunction,_bool> local_1f0;
  
  local_418._0_8_ = (unsigned_long *)0x0;
  local_418._8_8_ = (unsigned_long *)0x0;
  local_418._16_8_ = (pointer)0x0;
  this_00 = (LogicalGet *)operator_new(0x3d8);
  LogicalGet(this_00);
  local_498._M_head_impl = this_00;
  pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_498);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"table_index");
  iVar13 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
  pLVar14->table_index = CONCAT44(extraout_var,iVar13);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_498);
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xc9,"returned_types",&pLVar14->returned_types);
  pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_498);
  Deserializer::ReadProperty<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xca,"names",&pLVar14->names);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xcb,"column_ids",(vector<unsigned_long,_true> *)local_418);
  pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_498);
  ret = (_Rb_tree_header *)&pLVar14->projection_ids;
  Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
            (deserializer,0xcc,"projection_ids",(vector<unsigned_long,_true> *)ret);
  pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_498);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcd,"table_filters");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  TableFilterSet::Deserialize((TableFilterSet *)&local_1f0,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
  ::clear((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
           *)&pLVar14->table_filters);
  if ((_Base_ptr)
      local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.name.
      _M_string_length != (_Base_ptr)0x0) {
    ret = &(pLVar14->table_filters).filters._M_t._M_impl.super__Rb_tree_header;
    psVar1 = &local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function
              .name;
    (pLVar14->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (_Rb_tree_color)
         local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.name
         ._M_dataplus._M_p;
    (pLVar14->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.name
         ._M_string_length;
    (pLVar14->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.name
         .field_2._M_allocated_capacity;
    (pLVar14->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)
         local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.name
         .field_2._8_8_;
    *(_Rb_tree_header **)
     (local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.name.
      _M_string_length + 8) = ret;
    (pLVar14->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.
                 super_Function.extra_info._M_dataplus._M_p;
    local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.name.
    _M_string_length = 0;
    local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.
    extra_info._M_dataplus._M_p = (pointer)0x0;
    local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.name.
    field_2._M_allocated_capacity = (size_type)psVar1;
    local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.name.
    field_2._8_8_ = psVar1;
  }
  catalog_type = (CatalogType)ret;
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
               *)&local_1f0);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  FunctionSerializer::DeserializeBase<duckdb::TableFunction,duckdb::TableFunctionCatalogEntry>
            (&local_1f0,(FunctionSerializer *)deserializer,(Deserializer *)0x19,catalog_type);
  pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_498);
  ::std::__cxx11::string::_M_assign
            ((string *)
             &(pLVar14->function).super_SimpleNamedParameterFunction.super_SimpleFunction.
              super_Function.name);
  ::std::__cxx11::string::_M_assign
            ((string *)
             &(pLVar14->function).super_SimpleNamedParameterFunction.super_SimpleFunction.
              super_Function.extra_info);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pLVar14->function).super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pLVar14->function).super_SimpleNamedParameterFunction.super_SimpleFunction.
              original_arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.
              original_arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  if ((pair<duckdb::TableFunction,_bool> *)&pLVar14->function != &local_1f0) {
    (pLVar14->function).super_SimpleNamedParameterFunction.super_SimpleFunction.varargs.id_ =
         local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs.id_;
    (pLVar14->function).super_SimpleNamedParameterFunction.super_SimpleFunction.varargs.
    physical_type_ =
         local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs.
         physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(pLVar14->function).super_SimpleNamedParameterFunction.super_SimpleFunction.varargs.
                type_info_,
               &local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs.
                type_info_);
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(pLVar14->function).super_SimpleNamedParameterFunction.named_parameters,
               &local_1f0.first.super_SimpleNamedParameterFunction.named_parameters._M_h);
  }
  switchD_00b1522a::default(&(pLVar14->function).bind,&local_1f0.first.bind,0xd6);
  shared_ptr<duckdb::TableFunctionInfo,_true>::operator=
            (&(pLVar14->function).function_info,&local_1f0.first.function_info);
  (pLVar14->function).global_initialization = local_1f0.first.global_initialization;
  local_480 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
  if (local_1f0.second == false) {
    local_490.ptr = (FunctionData *)0x0;
    pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
    local_490.ptr = (FunctionData *)0x0;
    Deserializer::ReadProperty<duckdb::vector<duckdb::Value,true>>
              (deserializer,0xce,"parameters",&pLVar14->parameters);
    local_490.ptr = (FunctionData *)0x0;
    pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
    local_490.ptr = (FunctionData *)0x0;
    (*deserializer->_vptr_Deserializer[2])(deserializer,0xcf,"named_parameters");
    local_490.ptr = (FunctionData *)0x0;
    Deserializer::
    Read<std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
              ((type *)&local_3e0,deserializer);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(&(pLVar14->named_parameters)._M_h,&local_3e0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_3e0);
    local_490.ptr = (FunctionData *)0x0;
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    local_490.ptr = (FunctionData *)0x0;
    pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
    local_490.ptr = (FunctionData *)0x0;
    Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
              (deserializer,0xd0,"input_table_types",&pLVar14->input_table_types);
    local_490.ptr = (FunctionData *)0x0;
    pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
    local_490.ptr = (FunctionData *)0x0;
    Deserializer::ReadProperty<duckdb::vector<std::__cxx11::string,true>>
              (deserializer,0xd1,"input_table_names",&pLVar14->input_table_names);
  }
  else {
    FunctionSerializer::FunctionDeserialize<duckdb::TableFunction>
              ((FunctionSerializer *)&local_3e0,deserializer,&local_480->function);
    local_490.ptr = (FunctionData *)local_3e0.super_TableRef._vptr_TableRef;
  }
  pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_498);
  Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
            (deserializer,0xd2,"projected_input",&pLVar14->projected_input);
  pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_498);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::ColumnIndex,true>>
            (deserializer,0xd3,"column_indexes",&pLVar14->column_ids);
  if (local_418._0_8_ != local_418._8_8_) {
    pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
    uVar11 = local_418._8_8_;
    __args = (unsigned_long *)local_418._0_8_;
    if ((pLVar14->column_ids).
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pLVar14->column_ids).
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar23 = (SerializationException *)__cxa_allocate_exception(0x10);
      local_3e0.super_TableRef._vptr_TableRef = (_func_int **)&local_3e0.super_TableRef.alias;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3e0,
                 "LogicalGet::Deserialize - either column_ids or column_indexes should be set - not both"
                 ,"");
      SerializationException::SerializationException(pSVar23,(string *)&local_3e0);
      __cxa_throw(pSVar23,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    for (; __args != (unsigned_long *)uVar11; __args = __args + 1) {
      pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                            *)&local_498);
      ::std::vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>>::
      emplace_back<unsigned_long&>
                ((vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>> *)
                 &pLVar14->column_ids,__args);
    }
  }
  pCVar15 = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  _Var26._M_head_impl = local_490.ptr;
  local_328._M_buckets = &local_328._M_single_bucket;
  local_328._M_bucket_count = 1;
  local_328._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_328._M_element_count = 0;
  local_328._M_rehash_policy._M_max_load_factor = 1.0;
  local_328._M_rehash_policy._M_next_resize = 0;
  local_328._M_single_bucket = (__node_base_ptr)0x0;
  if (local_1f0.second == false) {
    local_418._24_8_ = this;
    TableFunctionRef::TableFunctionRef(&local_3e0);
    pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
    pLVar16 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
    pLVar17 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
    pLVar18 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
    peVar3 = (local_480->function).function_info.internal.
             super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pLVar19 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
    oVar10.ptr = (FunctionData *)local_490;
    local_2f0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&pLVar14->parameters;
    local_2f0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&pLVar16->named_parameters;
    local_2f0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&pLVar17->input_table_types;
    local_2d8 = &pLVar18->input_table_names;
    local_2c0 = &pLVar19->function;
    local_2c8._M_nxt = (_Hash_node_base *)0x0;
    local_2b8 = &local_3e0;
    local_438._16_8_ = (pointer)0x0;
    local_438._0_8_ = (pointer)0x0;
    local_438._8_8_ = (pointer)0x0;
    local_3e8._M_nxt = (_Hash_node_base *)0x0;
    local_3f8._M_allocated_capacity = 0;
    local_3f8._8_8_ = 0;
    p_Var4 = (local_480->function).bind;
    local_2d0 = peVar3;
    if (p_Var4 == (table_function_bind_t)0x0) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      local_478._0_8_ = local_478 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_478,"Table function \"%s\" has neither bind nor (de)serialize","");
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      pcVar8 = (local_480->function).super_SimpleNamedParameterFunction.super_SimpleFunction.
               super_Function.name._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar8,
                 pcVar8 + (local_480->function).super_SimpleNamedParameterFunction.
                          super_SimpleFunction.super_Function.name._M_string_length);
      InternalException::InternalException<std::__cxx11::string>
                (this_02,(string *)local_478,&local_210);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (*p_Var4)((ClientContext *)local_478,(TableFunctionBindInput *)pCVar15,&local_2f0,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)local_438);
    uVar11 = local_478._0_8_;
    local_478._0_8_ = (element_type *)0x0;
    if (oVar10.ptr != (FunctionData *)0x0) {
      (*(oVar10.ptr)->_vptr_FunctionData[1])(oVar10.ptr);
    }
    if ((element_type *)local_478._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_478._0_8_ + 8))();
    }
    p_Var2 = (local_480->function).get_virtual_columns;
    local_488 = (FunctionData *)uVar11;
    if (p_Var2 != (table_function_get_virtual_columns_t)0x0) {
      (*p_Var2)((virtual_column_map_t *)local_478,pCVar15,
                (optional_ptr<duckdb::FunctionData,_true>)uVar11);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_move_assign(&local_328,local_478);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_478);
    }
    pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
    pCVar5 = (pLVar14->column_ids).
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar27 = (pLVar14->column_ids).
                   super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                   super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                   _M_impl.super__Vector_impl_data._M_start; pCVar27 != pCVar5;
        pCVar27 = pCVar27 + 1) {
      params = (_Hash_node_base *)pCVar27->index;
      if (params < (_Hash_node_base *)0x8000000000000000) {
        pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                  operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                              *)&local_498);
        pvVar20 = vector<duckdb::LogicalType,_true>::operator[]
                            (&pLVar14->returned_types,(size_type)params);
        pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                  operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                              *)&local_498);
        pvVar21 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&pLVar14->names,(size_type)params);
        this_01 = vector<duckdb::LogicalType,_true>::operator[]
                            ((vector<duckdb::LogicalType,_true> *)local_438,(size_type)params);
        bVar12 = LogicalType::operator==(this_01,pvVar20);
        if (!bVar12) {
          pSVar23 = (SerializationException *)__cxa_allocate_exception(0x10);
          local_478._0_8_ = local_478 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,
                     "Table function deserialization failure in function \"%s\" - column with name %s was serialized with type %s, but now has type %s"
                     ,"");
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          pcVar8 = (local_480->function).super_SimpleNamedParameterFunction.super_SimpleFunction.
                   super_Function.name._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_280,pcVar8,
                     pcVar8 + (local_480->function).super_SimpleNamedParameterFunction.
                              super_SimpleFunction.super_Function.name._M_string_length);
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          pcVar8 = (pvVar21->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_368,pcVar8,pcVar8 + pvVar21->_M_string_length);
          LogicalType::LogicalType(&local_298,pvVar20);
          pvVar20 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)local_438,(size_type)params);
          LogicalType::LogicalType(&local_2b0,pvVar20);
          SerializationException::
          SerializationException<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
                    (pSVar23,(string *)local_478,&local_280,&local_368,&local_298,&local_2b0);
          __cxa_throw(pSVar23,&SerializationException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
      }
      else {
        p_Var6 = local_328._M_buckets[(ulong)params % local_328._M_bucket_count];
        p_Var22 = (__node_base_ptr)0x0;
        if ((p_Var6 != (__node_base_ptr)0x0) &&
           (p_Var22 = p_Var6, p_Var25 = p_Var6->_M_nxt, params != p_Var6->_M_nxt[1]._M_nxt)) {
          while (p_Var24 = p_Var25->_M_nxt, p_Var24 != (_Hash_node_base *)0x0) {
            p_Var22 = (__node_base_ptr)0x0;
            if (((ulong)p_Var24[1]._M_nxt % local_328._M_bucket_count !=
                 (ulong)params % local_328._M_bucket_count) ||
               (p_Var22 = p_Var25, p_Var25 = p_Var24, params == p_Var24[1]._M_nxt))
            goto LAB_007398c2;
          }
          p_Var22 = (__node_base_ptr)0x0;
        }
LAB_007398c2:
        if (p_Var22 == (__node_base_ptr)0x0) {
          p_Var24 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var24 = p_Var22->_M_nxt;
        }
        if (p_Var24 == (_Hash_node_base *)0x0) {
          pSVar23 = (SerializationException *)__cxa_allocate_exception(0x10);
          local_478._0_8_ = local_478 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,
                     "Table function deserialization failure - could not find virtual column with id %d"
                     ,"");
          SerializationException::SerializationException<unsigned_long>
                    (pSVar23,(string *)local_478,(unsigned_long)params);
          __cxa_throw(pSVar23,&SerializationException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
        pvVar20 = vector<duckdb::LogicalType,_true>::operator[]
                            ((vector<duckdb::LogicalType,_true> *)local_438,(size_type)params);
        bVar12 = LogicalType::operator==(pvVar20,(LogicalType *)(p_Var24 + 6));
        if (!bVar12) {
          pSVar23 = (SerializationException *)__cxa_allocate_exception(0x10);
          local_478._0_8_ = local_478 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,
                     "Table function deserialization failure in function \"%s\" - virtual column with name %s was serialized with type %s, but now has type %s"
                     ,"");
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          pcVar8 = (local_480->function).super_SimpleNamedParameterFunction.super_SimpleFunction.
                   super_Function.name._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,pcVar8,
                     pcVar8 + (local_480->function).super_SimpleNamedParameterFunction.
                              super_SimpleFunction.super_Function.name._M_string_length);
          local_348._0_8_ = local_348 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_348,p_Var24[2]._M_nxt,
                     (long)&(p_Var24[3]._M_nxt)->_M_nxt + (long)p_Var24[2]._M_nxt);
          LogicalType::LogicalType(&local_248,(LogicalType *)(p_Var24 + 6));
          pvVar20 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)local_438,(size_type)params);
          LogicalType::LogicalType(&local_260,pvVar20);
          SerializationException::
          SerializationException<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
                    (pSVar23,(string *)local_478,&local_230,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                     &local_248,&local_260);
          __cxa_throw(pSVar23,&SerializationException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
      }
    }
    pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_498);
    local_478._0_8_ =
         (pLVar14->returned_types).
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_478._8_8_ =
         (pLVar14->returned_types).
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_478._16_8_ =
         (pLVar14->returned_types).
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pLVar14->returned_types).
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_438._0_8_;
    (pLVar14->returned_types).
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_438._8_8_;
    (pLVar14->returned_types).
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_438._16_8_;
    local_438._0_8_ = (pointer)0x0;
    local_438._8_8_ = 0;
    local_438._16_8_ = 0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_478);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3f8._M_local_buf);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_438);
    this = (LogicalGet *)local_418._24_8_;
    _Var26._M_head_impl = local_488;
    local_3e0.super_TableRef._vptr_TableRef = (_func_int **)&PTR__TableFunctionRef_019b8000;
    if (local_3e0.subquery.
        super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
        .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_3e0.subquery.
                            super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
                            .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl +
                  8))();
    }
    local_3e0.subquery.
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
         (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
         (__uniq_ptr_data<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true,_true>
          )0x0;
    if (local_3e0.function.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
         )0x0) {
      (*((BaseExpression *)
        local_3e0.function.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
        _vptr_BaseExpression[1])();
    }
    local_3e0.function.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
          )0x0;
    TableRef::~TableRef(&local_3e0.super_TableRef);
  }
  else {
    p_Var2 = (local_480->function).get_virtual_columns;
    if (p_Var2 != (table_function_get_virtual_columns_t)0x0) {
      (*p_Var2)((virtual_column_map_t *)&local_3e0,pCVar15,local_490);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_move_assign(&local_328,&local_3e0);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_3e0);
    }
  }
  pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_498);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(pLVar14->virtual_columns)._M_h,&local_328);
  pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_498);
  _Var7._M_head_impl =
       (pLVar14->bind_data).
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  (pLVar14->bind_data).
  super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = _Var26._M_head_impl;
  if (_Var7._M_head_impl != (FunctionData *)0x0) {
    (*(_Var7._M_head_impl)->_vptr_FunctionData[1])();
  }
  _Var9._M_head_impl = local_498._M_head_impl;
  local_498._M_head_impl = (LogicalGet *)0x0;
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)_Var9._M_head_impl;
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_328);
  local_1f0.first.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.
  _vptr_Function = (_func_int **)&PTR__TableFunction_01999508;
  if (local_1f0.first.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f0.first.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)&local_1f0);
  if (local_498._M_head_impl != (LogicalGet *)0x0) {
    (*((local_498._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
  }
  if ((unsigned_long *)local_418._0_8_ != (unsigned_long *)0x0) {
    operator_delete((void *)local_418._0_8_);
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalGet::Deserialize(Deserializer &deserializer) {
	vector<column_t> legacy_column_ids;

	auto result = unique_ptr<LogicalGet>(new LogicalGet());
	deserializer.ReadProperty(200, "table_index", result->table_index);
	deserializer.ReadProperty(201, "returned_types", result->returned_types);
	deserializer.ReadProperty(202, "names", result->names);
	deserializer.ReadPropertyWithDefault(203, "column_ids", legacy_column_ids);
	deserializer.ReadProperty(204, "projection_ids", result->projection_ids);
	deserializer.ReadProperty(205, "table_filters", result->table_filters);
	auto entry = FunctionSerializer::DeserializeBase<TableFunction, TableFunctionCatalogEntry>(
	    deserializer, CatalogType::TABLE_FUNCTION_ENTRY);
	result->function = entry.first;
	auto &function = result->function;
	auto has_serialize = entry.second;
	unique_ptr<FunctionData> bind_data;
	if (!has_serialize) {
		deserializer.ReadProperty(206, "parameters", result->parameters);
		deserializer.ReadProperty(207, "named_parameters", result->named_parameters);
		deserializer.ReadProperty(208, "input_table_types", result->input_table_types);
		deserializer.ReadProperty(209, "input_table_names", result->input_table_names);
	} else {
		bind_data = FunctionSerializer::FunctionDeserialize(deserializer, function);
	}
	deserializer.ReadProperty(210, "projected_input", result->projected_input);
	deserializer.ReadPropertyWithDefault(211, "column_indexes", result->column_ids);
	if (!legacy_column_ids.empty()) {
		if (!result->column_ids.empty()) {
			throw SerializationException(
			    "LogicalGet::Deserialize - either column_ids or column_indexes should be set - not both");
		}
		for (auto &col_id : legacy_column_ids) {
			result->column_ids.emplace_back(col_id);
		}
	}
	auto &context = deserializer.Get<ClientContext &>();
	virtual_column_map_t virtual_columns;
	if (!has_serialize) {
		TableFunctionRef empty_ref;
		TableFunctionBindInput input(result->parameters, result->named_parameters, result->input_table_types,
		                             result->input_table_names, function.function_info.get(), nullptr, result->function,
		                             empty_ref);

		vector<LogicalType> bind_return_types;
		vector<string> bind_names;
		if (!function.bind) {
			throw InternalException("Table function \"%s\" has neither bind nor (de)serialize", function.name);
		}
		bind_data = function.bind(context, input, bind_return_types, bind_names);
		if (function.get_virtual_columns) {
			virtual_columns = function.get_virtual_columns(context, bind_data.get());
		}

		for (auto &col_id : result->column_ids) {
			if (col_id.IsVirtualColumn()) {
				auto idx = col_id.GetPrimaryIndex();
				auto ventry = virtual_columns.find(idx);
				if (ventry == virtual_columns.end()) {
					throw SerializationException(
					    "Table function deserialization failure - could not find virtual column with id %d", idx);
				}
				auto &ret_type = ventry->second.type;
				auto &col_name = ventry->second.name;
				if (bind_return_types[idx] != ret_type) {
					throw SerializationException(
					    "Table function deserialization failure in function \"%s\" - virtual column with "
					    "name %s was serialized with type %s, but now has type %s",
					    function.name, col_name, ret_type, bind_return_types[idx]);
				}
			} else {
				auto idx = col_id.GetPrimaryIndex();
				auto &ret_type = result->returned_types[idx];
				auto &col_name = result->names[idx];
				if (bind_return_types[idx] != ret_type) {
					throw SerializationException(
					    "Table function deserialization failure in function \"%s\" - column with "
					    "name %s was serialized with type %s, but now has type %s",
					    function.name, col_name, ret_type, bind_return_types[idx]);
				}
			}
		}
		result->returned_types = std::move(bind_return_types);
	} else if (function.get_virtual_columns) {
		virtual_columns = function.get_virtual_columns(context, bind_data.get());
	}
	result->virtual_columns = std::move(virtual_columns);
	result->bind_data = std::move(bind_data);
	return std::move(result);
}